

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall
Catch::RunContext::runCurrentTest(RunContext *this,string *redirectedCout,string *redirectedCerr)

{
  TestCase *pTVar1;
  RunningTest *pRVar2;
  pointer pUVar3;
  uint uVar4;
  pointer pUVar5;
  StreamRedirect cerrRedir;
  StreamRedirect coutRedir;
  allocator local_3fa;
  allocator local_3f9;
  string local_3f8;
  StreamRedirect local_3d8;
  StreamRedirect local_248;
  
  std::__cxx11::string::string((string *)&local_3d8,"TEST_CASE",&local_3f9);
  pTVar1 = this->m_runningTest->m_info;
  std::__cxx11::string::string((string *)&local_3f8,"",&local_3fa);
  AssertionInfo::AssertionInfo
            ((AssertionInfo *)&local_248,(string *)&local_3d8,&(pTVar1->super_TestCaseInfo).lineInfo
             ,&local_3f8,Normal);
  AssertionInfo::operator=(&this->m_lastAssertionInfo,(AssertionInfo *)&local_248);
  AssertionInfo::~AssertionInfo((AssertionInfo *)&local_248);
  std::__cxx11::string::~string((string *)&local_3f8);
  std::__cxx11::string::~string((string *)&local_3d8);
  pRVar2 = this->m_runningTest;
  pRVar2->m_runStatus = NothingRun;
  pRVar2->m_changed = false;
  pRVar2->m_lastSectionToRun = (RunningSection *)0x0;
  uVar4 = (*(((this->m_reporter).m_p)->super_IShared).super_NonCopyable._vptr_NonCopyable[4])();
  if ((uVar4 & 1) == 0) {
    (*(((this->m_runningTest->m_info->test).m_p)->super_IShared).super_NonCopyable._vptr_NonCopyable
      [4])();
  }
  else {
    StreamRedirect::StreamRedirect(&local_248,(ostream *)&std::cout,redirectedCout);
    StreamRedirect::StreamRedirect(&local_3d8,(ostream *)&std::cerr,redirectedCerr);
    (*(((this->m_runningTest->m_info->test).m_p)->super_IShared).super_NonCopyable._vptr_NonCopyable
      [4])();
    StreamRedirect::~StreamRedirect(&local_3d8);
    StreamRedirect::~StreamRedirect(&local_248);
  }
  RunningTest::ranToCompletion(this->m_runningTest);
  pUVar3 = (this->m_unfinishedSections).
           super__Vector_base<Catch::RunContext::UnfinishedSections,_std::allocator<Catch::RunContext::UnfinishedSections>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pUVar5 = (this->m_unfinishedSections).
                super__Vector_base<Catch::RunContext::UnfinishedSections,_std::allocator<Catch::RunContext::UnfinishedSections>_>
                ._M_impl.super__Vector_impl_data._M_start; pUVar5 != pUVar3; pUVar5 = pUVar5 + 1) {
    (*(this->super_IResultCapture)._vptr_IResultCapture[4])(this,pUVar5,&pUVar5->prevAssertions);
  }
  std::
  vector<Catch::RunContext::UnfinishedSections,_std::allocator<Catch::RunContext::UnfinishedSections>_>
  ::clear(&this->m_unfinishedSections);
  std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::clear(&this->m_messages);
  return;
}

Assistant:

void runCurrentTest( std::string& redirectedCout, std::string& redirectedCerr ) {
            try {
                m_lastAssertionInfo = AssertionInfo( "TEST_CASE", m_runningTest->getTestCase().getTestCaseInfo().lineInfo, "", ResultDisposition::Normal );
                m_runningTest->reset();

                if( m_reporter->getPreferences().shouldRedirectStdOut ) {
                    StreamRedirect coutRedir( std::cout, redirectedCout );
                    StreamRedirect cerrRedir( std::cerr, redirectedCerr );
                    m_runningTest->getTestCase().invoke();
                }
                else {
                    m_runningTest->getTestCase().invoke();
                }
                m_runningTest->ranToCompletion();
            }
            catch( TestFailureException& ) {
                // This just means the test was aborted due to failure
            }
            catch(...) {
                ExpressionResultBuilder exResult( ResultWas::ThrewException );
                exResult << translateActiveException();
                actOnCurrentResult( exResult.buildResult( m_lastAssertionInfo )  );
            }
            for( std::vector<UnfinishedSections>::const_iterator it = m_unfinishedSections.begin(),
                        itEnd = m_unfinishedSections.end();
                    it != itEnd;
                    ++it )
                sectionEnded( it->info, it->prevAssertions );
            m_unfinishedSections.clear();
            m_messages.clear();
        }